

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AlphaVectorWeighted.cpp
# Opt level: O1

void __thiscall
AlphaVectorWeighted::AlphaVectorWeighted
          (AlphaVectorWeighted *this,PlanningUnitDecPOMDPDiscrete *pu,
          vector<double,_std::allocator<double>_> *weights)

{
  double dVar1;
  _func_int *p_Var2;
  long lVar3;
  size_t sVar4;
  undefined8 *puVar5;
  uint uVar6;
  ulong uVar7;
  PlanningUnitMADPDiscrete *this_00;
  
  AlphaVectorPlanning::AlphaVectorPlanning
            ((AlphaVectorPlanning *)&(this->super_AlphaVectorPOMDP).field_0x58,pu);
  AlphaVectorPOMDP::AlphaVectorPOMDP
            (&this->super_AlphaVectorPOMDP,&PTR_construction_vtable_24__005ac078,pu);
  AlphaVectorBG::AlphaVectorBG
            ((AlphaVectorBG *)&(this->super_AlphaVectorPOMDP).field_0x8,
             &PTR_construction_vtable_24__005ac088,pu);
  (this->super_AlphaVectorPOMDP)._vptr_AlphaVectorPOMDP =
       (_func_int **)&PTR__AlphaVectorWeighted_005ac010;
  *(undefined ***)&(this->super_AlphaVectorPOMDP).field_0x58 = &PTR__AlphaVectorWeighted_005ac060;
  *(undefined ***)&(this->super_AlphaVectorPOMDP).field_0x8 = &PTR__AlphaVectorWeighted_005ac038;
  (this->super_AlphaVectorPOMDP).field_0x20 = 0;
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)&(this->super_AlphaVectorPOMDP).field_0x28,
             weights);
  *(undefined8 *)&(this->super_AlphaVectorPOMDP).field_0x40 = 0;
  *(undefined8 *)&(this->super_AlphaVectorPOMDP).field_0x48 = 0;
  *(undefined8 *)&(this->super_AlphaVectorPOMDP).field_0x50 = 0;
  uVar6 = 0;
  do {
    p_Var2 = (this->super_AlphaVectorPOMDP)._vptr_AlphaVectorPOMDP[-3];
    this_00 = *(PlanningUnitMADPDiscrete **)
               (&(this->super_AlphaVectorPOMDP).field_0x10 + (long)p_Var2);
    if (this_00 == (PlanningUnitMADPDiscrete *)0x0) {
      this_00 = *(PlanningUnitMADPDiscrete **)
                 (&(this->super_AlphaVectorPOMDP).field_0x18 + (long)p_Var2);
    }
    sVar4 = PlanningUnitMADPDiscrete::GetNrStates(this_00);
    uVar7 = (ulong)uVar6;
    if (sVar4 == uVar7) {
      BackProjectWeights(this);
      return;
    }
    lVar3 = *(long *)&(this->super_AlphaVectorPOMDP).field_0x28;
    if ((ulong)(*(long *)&(this->super_AlphaVectorPOMDP).field_0x30 - lVar3 >> 3) <= uVar7) {
      std::__throw_out_of_range_fmt
                ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",uVar7);
    }
    dVar1 = *(double *)(lVar3 + uVar7 * 8);
  } while ((0.0 <= dVar1) && (uVar6 = uVar6 + 1, dVar1 <= 1.0));
  puVar5 = (undefined8 *)__cxa_allocate_exception(0x28);
  *puVar5 = &PTR__E_0059bd80;
  puVar5[1] = puVar5 + 3;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)(puVar5 + 1),"AlphaVectorWeighted ctor: weights should be >=0 and <=1","");
  __cxa_throw(puVar5,&E::typeinfo,E::~E);
}

Assistant:

AlphaVectorWeighted::
AlphaVectorWeighted(const PlanningUnitDecPOMDPDiscrete* pu,
                    std::vector<double> weights) :
    AlphaVectorPlanning(pu),
    AlphaVectorPOMDP(pu),
    AlphaVectorBG(pu),
    _m_initialized(false),
    _m_weights(weights)
{
    for(Index s=0;s!=GetPU()->GetNrStates();++s)
        if(_m_weights.at(s) < 0 || _m_weights.at(s) > 1)
            throw(E("AlphaVectorWeighted ctor: weights should be >=0 and <=1"));
    BackProjectWeights();
}